

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,_3,_3,_0,_3,_3> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
_set_noalias<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *this,
          DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  ActualDstType actualDst;
  assign_op<double,_double> local_9;
  
  internal::
  call_dense_assignment_loop<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)this,(Matrix<double,__1,__1,_0,__1,__1> *)other,
             &local_9);
  return (Matrix<double,_3,_3,_0,_3,_3> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }